

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall flatbuffers::cpp::CppGenerator::GenIncludeDependencies(CppGenerator *this)

{
  Parser *pPVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer filepath;
  vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> included_files;
  string name_without_ext;
  string basename;
  vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> local_140;
  string *local_128;
  IDLOptions *local_120;
  pointer local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
    pPVar1 = (this->super_BaseGenerator).parser_;
    pbVar2 = (pPVar1->native_included_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__rhs = (pPVar1->native_included_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar2; __rhs = __rhs + 1) {
      std::operator+(&local_110,"#include \"",__rhs);
      std::operator+(&local_50,&local_110,"\"");
      CodeWriter::operator+=(&this->code_,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_110);
    }
  }
  Parser::GetIncludedFiles(&local_140,(this->super_BaseGenerator).parser_);
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<flatbuffers::IncludedFile*,std::vector<flatbuffers::IncludedFile,std::allocator<flatbuffers::IncludedFile>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_140.
             super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_140.
             super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_120 = &(this->opts_).super_IDLOptions;
  local_118 = local_140.
              super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_128 = &(this->opts_).super_IDLOptions.include_prefix;
  for (filepath = local_140.
                  super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
                  ._M_impl.super__Vector_impl_data._M_start; filepath != local_118;
      filepath = filepath + 1) {
    StripExtension(&local_110,&filepath->schema_name);
    if ((this->opts_).super_IDLOptions.keep_prefix == true) {
      std::__cxx11::string::string((string *)&local_70,(string *)&local_110);
    }
    else {
      StripPath(&local_70,&local_110);
    }
    BaseGenerator::GeneratedFileName
              (&local_d0,&this->super_BaseGenerator,local_128,&local_70,local_120);
    std::operator+(&local_b0,"#include \"",&local_d0);
    std::operator+(&local_90,&local_b0,"\"");
    CodeWriter::operator+=(&this->code_,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_110);
  }
  pPVar1 = (this->super_BaseGenerator).parser_;
  if (((pPVar1->native_included_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (pPVar1->native_included_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (local_140.
      super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_140.
      super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"",(allocator<char> *)&local_110);
    CodeWriter::operator+=(&this->code_,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::~vector
            (&local_140);
  return;
}

Assistant:

void GenIncludeDependencies() {
    if (opts_.generate_object_based_api) {
      for (const std::string &native_included_file :
           parser_.native_included_files_) {
        code_ += "#include \"" + native_included_file + "\"";
      }
    }

    // Get the directly included file of the file being parsed.
    std::vector<IncludedFile> included_files(parser_.GetIncludedFiles());

    // We are safe to sort them alphabetically, since there shouldn't be any
    // interdependence between them.
    std::stable_sort(included_files.begin(), included_files.end());

    for (const IncludedFile &included_file : included_files) {
      // Get the name of the included file as defined by the schema, and strip
      // the .fbs extension.
      const std::string name_without_ext =
          StripExtension(included_file.schema_name);

      // If we are told to keep the prefix of the included schema, leave it
      // unchanged, otherwise strip the leading path off so just the "basename"
      // of the include is retained.
      const std::string basename =
          opts_.keep_prefix ? name_without_ext : StripPath(name_without_ext);

      code_ += "#include \"" +
               GeneratedFileName(opts_.include_prefix, basename, opts_) + "\"";
    }

    if (!parser_.native_included_files_.empty() || !included_files.empty()) {
      code_ += "";
    }
  }